

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinSubstr
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  pointer pVVar1;
  ulong uVar2;
  anon_union_8_3_4e909c26_for_v aVar3;
  ostream *poVar4;
  RuntimeError *pRVar5;
  allocator_type *in_RCX;
  size_type __n;
  size_type sVar6;
  ulong __pos;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar7;
  allocator<char> local_1e9;
  string local_1e8;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_1c8;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  local_1a0 [23];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&ss,"substr",&local_1e9);
  local_1e8._M_dataplus._M_p = (pointer)0x200000013;
  local_1e8._M_string_length._0_4_ = 2;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_1e8;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)&local_1c8,__l,in_RCX);
  validateBuiltinArgs(this,loc,(string *)&ss,args,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                       *)&local_1c8);
  std::
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~_Vector_base(&local_1c8);
  std::__cxx11::string::~string((string *)&ss);
  pVVar1 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __pos = (ulong)pVVar1[1].v.d;
  if ((long)__pos < 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar4 = std::operator<<((ostream *)local_1a0,
                             "substr second parameter should be greater than zero, got ");
    std::ostream::_M_insert<long>((long)poVar4);
    pRVar5 = (RuntimeError *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    Stack::makeError(pRVar5,&this->stack,loc,&local_1e8);
    __cxa_throw(pRVar5,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  sVar6 = (size_type)pVVar1[2].v.d;
  if (-1 < (long)sVar6) {
    uVar2 = *(ulong *)&(pVVar1->v).h[1].mark;
    if (uVar2 < __pos) {
      _ss = (pointer)local_1a0;
      local_1a0[0]._M_local_buf[0] = L'\0';
      VVar7 = makeString(this,(UString *)&ss);
      aVar3 = VVar7._0_8_;
    }
    else {
      __n = uVar2 - __pos;
      if (sVar6 + __pos <= uVar2) {
        __n = sVar6;
      }
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      substr((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)&ss,
             (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             ((pVVar1->v).h + 1),__pos,__n);
      VVar7 = makeString(this,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                               *)&ss);
      aVar3 = VVar7._0_8_;
    }
    (this->scratch).t = STRING;
    (this->scratch).v = aVar3;
    std::__cxx11::u32string::~u32string((u32string *)&ss);
    return (AST *)0x0;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar4 = std::operator<<((ostream *)local_1a0,
                           "substr third parameter should be greater than zero, got ");
  std::ostream::_M_insert<long>((long)poVar4);
  pRVar5 = (RuntimeError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  Stack::makeError(pRVar5,&this->stack,loc,&local_1e8);
  __cxa_throw(pRVar5,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *builtinSubstr(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "substr", args, {Value::STRING, Value::NUMBER, Value::NUMBER});
        const auto *str = static_cast<const HeapString *>(args[0].v.h);
        long from = long(args[1].v.d);
        long len = long(args[2].v.d);
        if (from < 0) {
            std::stringstream ss;
            ss << "substr second parameter should be greater than zero, got " << from;
            throw makeError(loc, ss.str());
        }
        if (len < 0) {
            std::stringstream ss;
            ss << "substr third parameter should be greater than zero, got " << len;
            throw makeError(loc, ss.str());
        }
        if (static_cast<unsigned long>(from) > str->value.size()) {
            scratch = makeString(UString());
            return nullptr;
        }
        if (size_t(len + from) > str->value.size()) {
          len = str->value.size() - from;
        }
        scratch = makeString(str->value.substr(from, len));
        return nullptr;
    }